

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
GetScriptBufferDetails
          (JsValueRef scriptVal,JsParseScriptAttributes parseAttributes,LoadScriptFlag *scriptFlag,
          size_t *cb,byte **script)

{
  bool bVar1;
  uint uVar2;
  LoadScriptFlag LVar3;
  charcount_t cVar4;
  byte *pbVar5;
  
  if (script == (byte **)0x0 || (cb == (size_t *)0x0 || scriptFlag == (LoadScriptFlag *)0x0)) {
    return JsErrorNullArgument;
  }
  *scriptFlag = LoadScriptFlag_None;
  *cb = 0;
  *script = (byte *)0x0;
  bVar1 = Js::VarIs<Js::ArrayBuffer>(scriptVal);
  if (bVar1) {
    pbVar5 = (byte *)(**(code **)(*scriptVal + 0x390))(scriptVal);
    *script = pbVar5;
    uVar2 = (**(code **)(*scriptVal + 0x388))(scriptVal);
    *cb = (ulong)uVar2;
    LVar3 = LoadScriptFlag_ExternalArrayBuffer|LoadScriptFlag_Utf8Source;
    if ((parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded) ==
        JsParseScriptAttributeNone) goto LAB_0037477a;
  }
  else {
    bVar1 = Js::VarIs<Js::JavascriptString>(scriptVal);
    if (!bVar1) {
      return JsErrorInvalidArgument;
    }
    pbVar5 = (byte *)(**(code **)(*scriptVal + 0x328))(scriptVal);
    *script = pbVar5;
    cVar4 = Js::JavascriptString::GetSizeInBytes((JavascriptString *)scriptVal);
    *cb = (ulong)cVar4;
  }
  LVar3 = LoadScriptFlag_None;
LAB_0037477a:
  *scriptFlag = LVar3;
  return JsNoError;
}

Assistant:

JsErrorCode GetScriptBufferDetails(
    _In_ JsValueRef scriptVal,
    _In_ JsParseScriptAttributes parseAttributes,
    _Out_ LoadScriptFlag* scriptFlag,
    _Out_ size_t* cb,
    _Out_ const byte** script)
{
    PARAM_NOT_NULL(scriptFlag);
    PARAM_NOT_NULL(cb);
    PARAM_NOT_NULL(script);

    *scriptFlag = LoadScriptFlag_None;
    *cb = 0;
    *script = nullptr;

    const bool isExternalArray = Js::VarIs<Js::ArrayBuffer>(scriptVal);
    const bool isString = !isExternalArray && Js::VarIs<Js::JavascriptString>(scriptVal);
    if (!isExternalArray && !isString)
    {
        return JsErrorInvalidArgument;
    }
    const bool isUtf8 = !isString && !(parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded);

    *script = isExternalArray ?
        ((Js::ExternalArrayBuffer*)(scriptVal))->GetBuffer() :
        (const byte*)((Js::JavascriptString*)(scriptVal))->GetSz();
    *cb = isExternalArray ?
        ((Js::ExternalArrayBuffer*)(scriptVal))->GetByteLength() :
        ((Js::JavascriptString*)(scriptVal))->GetSizeInBytes();

    if (isExternalArray && isUtf8)
    {
        *scriptFlag = (LoadScriptFlag)(LoadScriptFlag_ExternalArrayBuffer | LoadScriptFlag_Utf8Source);
    }
    else if (isUtf8)
    {
        *scriptFlag = (LoadScriptFlag)(LoadScriptFlag_Utf8Source);
    }
    else
    {
        *scriptFlag = LoadScriptFlag_None;
    }

    return JsNoError;
}